

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall
Assimp::PretransformVertices::BuildMeshRefCountArray
          (PretransformVertices *this,aiNode *nd,uint *refs)

{
  ulong uVar1;
  
  if (nd->mNumMeshes != 0) {
    uVar1 = 0;
    do {
      refs[nd->mMeshes[uVar1]] = refs[nd->mMeshes[uVar1]] + 1;
      uVar1 = uVar1 + 1;
    } while (uVar1 < nd->mNumMeshes);
  }
  if (nd->mNumChildren != 0) {
    uVar1 = 0;
    do {
      BuildMeshRefCountArray(this,nd->mChildren[uVar1],refs);
      uVar1 = uVar1 + 1;
    } while (uVar1 < nd->mNumChildren);
  }
  return;
}

Assistant:

void PretransformVertices::BuildMeshRefCountArray(aiNode* nd, unsigned int * refs)
{
    for (unsigned int i = 0; i< nd->mNumMeshes;++i)
        refs[nd->mMeshes[i]]++;

    // call children
    for (unsigned int i = 0; i < nd->mNumChildren;++i)
        BuildMeshRefCountArray(nd->mChildren[i],refs);
}